

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
find_idom(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *__return_storage_ptr__,
         map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
         *nodes)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  key_type *__k;
  bool bVar3;
  BasicBlock *__k_00;
  _Base_ptr p_Var4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  _Self __tmp_1;
  size_t *this;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  _Self __tmp;
  long lVar14;
  int i;
  ulong uVar15;
  vector<int,_std::allocator<int>_> visit;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> N;
  vector<int,_std::allocator<int>_> v1;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom;
  vector<int,_std::allocator<int>_> v2_1;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  _Vector_base<int,_std::allocator<int>_> local_198;
  _Vector_base<int,_std::allocator<int>_> local_180;
  _Vector_base<int,_std::allocator<int>_> local_168;
  _Vector_base<int,_std::allocator<int>_> local_150;
  _Vector_base<int,_std::allocator<int>_> local_138;
  _Vector_base<int,_std::allocator<int>_> local_120;
  _Vector_base<int,_std::allocator<int>_> local_108;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  _Vector_base<int,_std::allocator<int>_> local_c0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_78;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::_Rb_tree(&local_78,&nodes->_M_t);
  __k_00 = find_exit((map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                      *)&local_78);
  std::
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  ::~_Rb_tree(&local_78);
  dom._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dom._M_t._M_impl.super__Rb_tree_header._M_header;
  dom._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dom._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dom._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lVar14 = 0;
  dom._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dom._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2); uVar15 = uVar15 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&N,(value_type_conflict3 *)
                  ((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14));
    lVar14 = lVar14 + 4;
  }
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       CONCAT44(q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map._4_4_,0xfffffffe);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&N,(int *)&q);
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       CONCAT44(q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&N,(int *)&q);
  for (p_Var4 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(nodes->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    p_Var9 = p_Var4 + 1;
    if (p_Var4[1]._M_color == ~_S_red) {
      visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::push_back(&visit,(value_type_conflict3 *)p_Var9);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
      pair<std::vector<int,_std::allocator<int>_>_&,_true>
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&q,(int *)p_Var9,&visit
                );
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                  *)&dom,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&q);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_map_size);
      this = (size_t *)&visit;
    }
    else {
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
      pair<std::vector<int,_std::allocator<int>_>_&,_true>
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&q,(int *)p_Var9,&N);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                  *)&dom,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)&q);
      this = &q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_map_size;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this);
  }
  uVar13 = 0;
  bVar3 = false;
  do {
    for (; bVar11 = bVar3, uVar15 = (ulong)uVar13,
        uVar15 < (ulong)((long)N.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)N.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2); uVar13 = uVar13 + 1) {
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
              ::find(&nodes->_M_t,
                     N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start + uVar15);
      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_start.
      _M_cur = (_Elt_pointer)0x0;
      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)0x0;
      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size =
           0;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&q,
                 N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + uVar15);
      p_Var4 = iVar5._M_node[1]._M_parent[1]._M_right;
      if (*(_Base_ptr *)(iVar5._M_node[1]._M_parent + 2) != p_Var4) {
        iVar6 = std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&dom._M_t,*(key_type **)p_Var4);
        std::vector<int,_std::allocator<int>_>::vector
                  (&visit,(vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
        for (uVar12 = 1; p_Var4 = iVar5._M_node[1]._M_parent[1]._M_right,
            uVar12 < (ulong)(*(long *)(iVar5._M_node[1]._M_parent + 2) - (long)p_Var4 >> 3);
            uVar12 = uVar12 + 1) {
          iVar6 = std::
                  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&dom._M_t,*(key_type **)(&p_Var4->_M_color + uVar12 * 2));
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_90,&visit);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_a8,
                     (vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
          vectors_intersection
                    ((vector<int,_std::allocator<int>_> *)
                     &v1.super__Vector_base<int,_std::allocator<int>_>,
                     (vector<int,_std::allocator<int>_> *)&local_90,
                     (vector<int,_std::allocator<int>_> *)&local_a8);
          std::vector<int,_std::allocator<int>_>::_M_move_assign
                    (&visit,&v1.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&v1.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_c0,
                   (vector<int,_std::allocator<int>_> *)&q);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_d8,&visit);
        vectors_set_union((vector<int,_std::allocator<int>_> *)
                          &v1.super__Vector_base<int,_std::allocator<int>_>,
                          (vector<int,_std::allocator<int>_> *)&local_c0,
                          (vector<int,_std::allocator<int>_> *)&local_d8);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  ((vector<int,_std::allocator<int>_> *)&q,
                   &v1.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&v1.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&visit.super__Vector_base<int,_std::allocator<int>_>);
      }
      iVar6 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&dom._M_t,
                     N.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start + uVar15);
      if ((long)iVar6._M_node[1]._M_left - (long)iVar6._M_node[1]._M_parent !=
          q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
          _M_map_size -
          (long)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_map) {
        pmVar7 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](&dom,N.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar15);
        bVar11 = true;
        std::vector<int,_std::allocator<int>_>::operator=
                  (pmVar7,(vector<int,_std::allocator<int>_> *)&q);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&q);
      bVar3 = bVar11;
    }
    uVar13 = 0;
    p_Var9 = dom._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = false;
  } while (bVar11);
  for (; (_Rb_tree_header *)p_Var9 != &dom._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    _Var8 = std::
            __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       p_Var9[1]._M_parent,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       p_Var9[1]._M_left,(_Iter_equals_val<const_int>)(p_Var9 + 1));
    std::vector<int,_std::allocator<int>_>::erase
              ((vector<int,_std::allocator<int>_> *)&p_Var9[1]._M_parent,
               (const_iterator)_Var8._M_current,(const_iterator)p_Var9[1]._M_left);
  }
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&q);
  iVar6 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::find(&dom._M_t,&__k_00->id);
  std::vector<int,_std::allocator<int>_>::vector
            (&v1,(vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
  if (v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    iVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::find(&dom._M_t,
                   v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start);
    std::vector<int,_std::allocator<int>_>::vector
              (&v2,(vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
    lVar14 = 4;
    for (uVar15 = 1;
        uVar15 < (ulong)((long)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2); uVar15 = uVar15 + 1) {
      iVar6 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&dom._M_t,
                     (key_type *)
                     ((long)v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar14));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_f0,&v2);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_108,
                 (vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
      vectors_set_union((vector<int,_std::allocator<int>_> *)
                        &v2_1.super__Vector_base<int,_std::allocator<int>_>,
                        (vector<int,_std::allocator<int>_> *)&local_f0,
                        (vector<int,_std::allocator<int>_> *)&local_108);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (&v2,&v2_1.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&v2_1.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
      lVar14 = lVar14 + 4;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_180,&v1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_198,&v2);
    vectors_difference(&v2_1,(vector<int,_std::allocator<int>_> *)&local_180,
                       (vector<int,_std::allocator<int>_> *)&local_198);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&v1,&v2_1.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v2_1.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_198);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_180);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v2.super__Vector_base<int,_std::allocator<int>_>);
  }
  pmVar7 = std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&dom,&__k_00->id);
  std::vector<int,_std::allocator<int>_>::operator=(pmVar7,&v1);
  std::vector<int,_std::allocator<int>_>::push_back(&visit,&__k_00->id);
  std::deque<int,_std::allocator<int>_>::push_back(&q.c,&__k_00->id);
  while (q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
         _M_cur != q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                   _M_start._M_cur) {
    iVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
            ::find(&nodes->_M_t,
                   q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                   _M_start._M_cur);
    p_Var4 = iVar5._M_node[1]._M_parent;
    std::deque<int,_std::allocator<int>_>::pop_front(&q.c);
    uVar15 = 0;
    while( true ) {
      p_Var2 = p_Var4[1]._M_right;
      if ((ulong)(*(long *)(p_Var4 + 2) - (long)p_Var2 >> 3) <= uVar15) break;
      __k = *(key_type **)(&p_Var2->_M_color + uVar15 * 2);
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (_Var8._M_current ==
          visit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar6 = std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&dom._M_t,__k);
        std::vector<int,_std::allocator<int>_>::vector
                  (&v2,(vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
        if (v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            (key_type *)
            CONCAT44(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (_Rb_tree_color)
                     v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start)) {
          iVar6 = std::
                  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&dom._M_t,
                         (key_type *)
                         CONCAT44(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (_Rb_tree_color)
                                  v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start));
          std::vector<int,_std::allocator<int>_>::vector
                    (&v2_1,(vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
          lVar14 = 4;
          for (uVar12 = 1;
              uVar12 < (ulong)((long)v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               CONCAT44(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        (_Rb_tree_color)
                                        v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2); uVar12 = uVar12 + 1
              ) {
            iVar6 = std::
                    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::find(&dom._M_t,
                           (key_type *)
                           (CONCAT44(v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     (_Rb_tree_color)
                                     v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) + lVar14));
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_120,&v2_1);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_138,
                       (vector<int,_std::allocator<int>_> *)&iVar6._M_node[1]._M_parent);
            vectors_set_union((vector<int,_std::allocator<int>_> *)&local_48,
                              (vector<int,_std::allocator<int>_> *)&local_120,
                              (vector<int,_std::allocator<int>_> *)&local_138);
            std::vector<int,_std::allocator<int>_>::_M_move_assign(&v2_1,&local_48);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_138);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_120);
            lVar14 = lVar14 + 4;
          }
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_150,&v2);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_168,&v2_1);
          vectors_difference((vector<int,_std::allocator<int>_> *)&local_48,
                             (vector<int,_std::allocator<int>_> *)&local_150,
                             (vector<int,_std::allocator<int>_> *)&local_168);
          std::vector<int,_std::allocator<int>_>::_M_move_assign(&v2,&local_48);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_168);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_150);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&v2_1.super__Vector_base<int,_std::allocator<int>_>);
        }
        pmVar7 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](&dom,__k);
        std::vector<int,_std::allocator<int>_>::operator=
                  (pmVar7,(vector<int,_std::allocator<int>_> *)
                          &v2.super__Vector_base<int,_std::allocator<int>_>);
        std::vector<int,_std::allocator<int>_>::push_back(&visit,__k);
        std::deque<int,_std::allocator<int>_>::push_back(&q.c,__k);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&v2.super__Vector_base<int,_std::allocator<int>_>);
      }
      uVar15 = uVar15 + 1;
    }
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var4 = dom._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &dom._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1]._M_left != p_Var4[1]._M_parent) {
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _0_4_ = p_Var4[1]._M_color;
      v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _4_4_ = (p_Var4[1]._M_parent)->_M_color;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_insert_unique<std::pair<int_const,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,(pair<const_int,_int> *)&v2);
    }
  }
  poVar10 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar10 = std::operator<<(poVar10,"*** desplay idom ***");
  std::endl<char,std::char_traits<char>>(poVar10);
  for (p_Var4 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,p_Var4[1]._M_color);
    poVar10 = std::operator<<(poVar10," ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&p_Var4[1].field_0x4);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&q);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&visit.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&N.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&dom._M_t);
  return __return_storage_ptr__;
}

Assistant:

map<int, int> find_idom(map<int, BasicBlock*> nodes) {
  BasicBlock* exit = find_exit(nodes);

  // step1: Calculate the domin nodes of each block
  // rule: Dom(n) = {n} ∩ Dom(Pred(n))
  map<int, vector<int>> dom;

  // step1.1: initialize dom
  map<int, BasicBlock*>::iterator it;
  vector<int> N;
  for (int i = 0; i < order.size(); i++) {
    N.push_back(order[i]);
  }
  N.push_back(-2);
  N.push_back(-1);
  for (it = nodes.begin(); it != nodes.end(); it++) {
    if (it->first == -1) {
      vector<int> pre;
      pre.push_back(it->first);
      dom.insert(map<int, vector<int>>::value_type(it->first, pre));
    } else {
      dom.insert(map<int, vector<int>>::value_type(it->first, N));
    }
  }

  // step1.2: Loop until dom does not change
  bool flag = true;
  map<int, vector<int>>::iterator iter;
  while (flag) {
    flag = false;
    for (int i = 0; i < N.size(); i++) {
      it = nodes.find(N[i]);
      vector<int> temp;
      temp.push_back(N[i]);
      if (it->second->preBlock.size() > 0) {
        iter = dom.find(it->second->preBlock[0]->id);
        vector<int> v1 = iter->second;
        for (int j = 1; j < it->second->preBlock.size(); j++) {
          iter = dom.find(it->second->preBlock[j]->id);
          v1 = vectors_intersection(v1, iter->second);
        }
        temp = vectors_set_union(temp, v1);
      }
      iter = dom.find(N[i]);
      // the set size monotonically decreases, so if the set size is the same
      // the set contents are the same
      if (iter->second.size() != temp.size()) {
        dom[N[i]] = temp;
        flag = true;
      }
    }
  }
  /*cout << endl << "*** desplay dom ***" << endl;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/

  // step2: Calculate the immediate domin nodes of each block
  // step2.1: delete node itself;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    iter->second.erase(
        remove(iter->second.begin(), iter->second.end(), iter->first),
        iter->second.end());
  }

  // step2.2: BFS
  vector<int> visit;
  queue<int> q;
  iter = dom.find(exit->id);
  vector<int> v1 = iter->second;
  if (v1.size() > 0) {
    iter = dom.find(v1[0]);
    vector<int> v2 = iter->second;
    for (int i = 1; i < v1.size(); i++) {
      iter = dom.find(v1[i]);
      v2 = vectors_set_union(v2, iter->second);
    }
    v1 = vectors_difference(v1, v2);
  }
  dom[exit->id] = v1;
  visit.push_back(exit->id);
  q.push(exit->id);
  while (!q.empty()) {
    map<int, BasicBlock*>::iterator itt = nodes.find(q.front());
    BasicBlock* p = itt->second;
    q.pop();
    for (int i = 0; i < p->preBlock.size(); i++) {
      BasicBlock* prep = p->preBlock[i];
      vector<int>::iterator itt = find(visit.begin(), visit.end(), prep->id);
      if (itt == visit.end()) {  // never visit
        iter = dom.find(prep->id);
        vector<int> v1 = iter->second;
        if (v1.size() > 0) {
          iter = dom.find(v1[0]);
          vector<int> v2 = iter->second;
          for (int i = 1; i < v1.size(); i++) {
            iter = dom.find(v1[i]);
            v2 = vectors_set_union(v2, iter->second);
          }
          v1 = vectors_difference(v1, v2);
        }
        dom[prep->id] = v1;
        visit.push_back(prep->id);
        q.push(prep->id);
      }
    }
  }
  /*for (iter = dom.begin(); iter != dom.end(); iter++) {
      cout << iter->first;
      for (int i = 0; i < iter->second.size(); i++) {
          cout << " " << iter->second[i];
      }
      cout << endl;
  }*/
  map<int, int> dom1;
  for (iter = dom.begin(); iter != dom.end(); iter++) {
    if (iter->second.size() > 0) {
      dom1.insert(map<int, int>::value_type(iter->first, iter->second[0]));
    }
  }
  map<int, int>::iterator i;
  cout << endl << "*** desplay idom ***" << endl;
  for (i = dom1.begin(); i != dom1.end(); i++) {
    cout << i->first << " " << i->second << endl;
  }
  return dom1;
}